

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int __thiscall CServer::Init(CServer *this)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)this->m_aClients[0].m_LatestInput.m_aData + lVar2 + -0x28) = 0;
    this->m_aClients[0].m_aName[lVar2] = '\0';
    this->m_aClients[0].m_aClan[lVar2] = '\0';
    pcVar1 = this->m_aClients[0].m_aClan + lVar2 + 0x37;
    pcVar1[0] = -1;
    pcVar1[1] = -1;
    pcVar1[2] = -1;
    pcVar1[3] = -1;
    CSnapshotStorage::Init
              ((CSnapshotStorage *)((long)this->m_aClients[0].m_LatestInput.m_aData + lVar2 + -0x10)
              );
    lVar2 = lVar2 + 0x195f0;
  } while (lVar2 != 0x657c00);
  (this->super_IServer).m_CurrentGameTick = 0;
  return 0;
}

Assistant:

int CServer::Init()
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		m_aClients[i].m_State = CClient::STATE_EMPTY;
		m_aClients[i].m_aName[0] = 0;
		m_aClients[i].m_aClan[0] = 0;
		m_aClients[i].m_Country = -1;
		m_aClients[i].m_Snapshots.Init();
	}

	m_CurrentGameTick = 0;

	return 0;
}